

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::splice_move(CVmObjStringBuffer *this,int32_t idx,int32_t del,int32_t ins)

{
  int iVar1;
  vm_strbuf_ext *pvVar2;
  vm_strbuf_ext *pvVar3;
  vm_strbuf_ext *pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  CVmObjStringBuffer *in_RDI;
  int32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_EDX < in_ECX) {
    ensure_added_space((CVmObjStringBuffer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
  }
  if (in_ECX != in_EDX) {
    pvVar2 = get_ext(in_RDI);
    if (in_ESI + in_EDX < pvVar2->len) {
      pvVar2 = get_ext(in_RDI);
      pvVar3 = get_ext(in_RDI);
      pvVar4 = get_ext(in_RDI);
      memmove(pvVar2->buf + (long)in_ESI + (long)in_ECX,pvVar3->buf + (long)in_ESI + (long)in_EDX,
              (long)(pvVar4->len - (in_ESI + in_EDX)) << 2);
    }
  }
  iVar1 = in_ECX - in_EDX;
  pvVar2 = get_ext(in_RDI);
  pvVar2->len = iVar1 + pvVar2->len;
  return;
}

Assistant:

void CVmObjStringBuffer::splice_move(
    VMG_ int32_t idx, int32_t del, int32_t ins)
{
    /* 
     *   if we're adding more than we're deleting, expand the buffer if
     *   necessary to accommodate the added length 
     */
    if (ins > del)
        ensure_added_space(vmg_ ins - del);

    /* 
     *   if we're doing a net insertion or deletion, move the part of the
     *   string after the deleted text so that it'll be aligned at the end of
     *   the inserted text 
     */
    if (ins != del && idx + del < get_ext()->len)
        memmove(get_ext()->buf + idx + ins,
                get_ext()->buf + idx + del,
                (get_ext()->len - (idx + del)) * sizeof(wchar_t));

    /* adjust the buffer length */
    get_ext()->len += ins - del;
}